

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

void __thiscall
Semantic::Err::UndeclaredLocalVariable::UndeclaredLocalVariable
          (UndeclaredLocalVariable *this,string *varName)

{
  this->super_Error = (Error)&PTR__UndeclaredLocalVariable_0014c440;
  (this->varName)._M_dataplus._M_p = (pointer)&(this->varName).field_2;
  (this->varName)._M_string_length = 0;
  (this->varName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->varName);
  return;
}

Assistant:

UndeclaredLocalVariable(std::string varName) : Error() {
                this->varName = varName;
            }